

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O0

int coda_mem_type_update(coda_dynamic_type **type,coda_type *definition)

{
  coda_dynamic_type *pcVar1;
  int iVar2;
  coda_mem_array *type_00;
  coda_mem_data *pcVar3;
  coda_type *pcVar4;
  coda_type *local_48;
  coda_dynamic_type **new_field_type;
  coda_mem_record *record_type;
  int i;
  coda_mem_type *mem_type;
  coda_type *definition_local;
  coda_dynamic_type **type_local;
  
  if (((*type)->backend == coda_backend_ascii) || ((*type)->backend == coda_backend_binary)) {
    if ((*type)->backend < coda_backend_memory) {
      local_48 = (coda_type *)*type;
    }
    else {
      local_48 = (*type)->definition;
    }
    if (local_48 != definition) {
      __assert_fail("coda_get_type_for_dynamic_type(*type) == definition",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                    ,0x68,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
    }
    type_local._4_4_ = 0;
  }
  else {
    if ((*type)->backend != coda_backend_memory) {
      __assert_fail("(*type)->backend == coda_backend_memory",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                    ,0x6c,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
    }
    if ((*type)->definition != definition) {
      if ((definition->type_class == coda_array_class) &&
         ((*type)->definition->type_class != coda_array_class)) {
        if (definition->format != coda_format_xml) {
          __assert_fail("definition->format == coda_format_xml",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                        ,0x72,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
        }
        type_00 = coda_mem_array_new((coda_type_array *)definition,(coda_dynamic_type *)0x0);
        if (type_00 == (coda_mem_array *)0x0) {
          return -1;
        }
        iVar2 = coda_mem_type_update(type,*(coda_type **)(definition + 1));
        if (iVar2 != 0) {
          coda_dynamic_type_delete((coda_dynamic_type *)type_00);
          return -1;
        }
        iVar2 = coda_mem_array_add_element(type_00,*type);
        if (iVar2 != 0) {
          coda_dynamic_type_delete((coda_dynamic_type *)type_00);
          return -1;
        }
        *type = (coda_dynamic_type *)type_00;
        iVar2 = coda_mem_type_update(type,definition);
        return iVar2;
      }
      if (((*type)->definition->type_class != coda_record_class) ||
         (definition->type_class != coda_text_class)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                      ,0x9d,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
      }
      if ((*type)->definition->format != coda_format_xml) {
        __assert_fail("(*type)->definition->format == coda_format_xml",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                      ,0x8d,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
      }
      if ((*type)->definition[1].name != (char *)0x0) {
        __assert_fail("((coda_type_record *)(*type)->definition)->num_fields == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                      ,0x8e,"int coda_mem_type_update(coda_dynamic_type **, coda_type *)");
      }
      pcVar3 = coda_mem_string_new((coda_type_text *)definition,(coda_dynamic_type *)0x0,
                                   (coda_product *)0x0,(char *)0x0);
      if (pcVar3->attributes != (coda_dynamic_type *)0x0) {
        coda_dynamic_type_delete(pcVar3->attributes);
      }
      pcVar3->attributes = (coda_dynamic_type *)(*type)[1].definition;
      (*type)[1].definition = (coda_type *)0x0;
      coda_dynamic_type_delete(*type);
      *type = (coda_dynamic_type *)pcVar3;
    }
    pcVar1 = *type;
    switch(pcVar1[1].backend) {
    case coda_backend_ascii:
      if (*(long *)(pcVar1 + 2) < (long)pcVar1->definition[1].name) {
        pcVar4 = (coda_type *)realloc(pcVar1[2].definition,(long)pcVar1->definition[1].name << 3);
        if (pcVar4 == (coda_type *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                         (long)pcVar1->definition[1].name << 3,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                         ,0xb5);
          return -1;
        }
        pcVar1[2].definition = pcVar4;
        for (record_type._4_4_ = (int)*(undefined8 *)(pcVar1 + 2);
            (long)record_type._4_4_ < (long)pcVar1->definition[1].name;
            record_type._4_4_ = record_type._4_4_ + 1) {
          *(undefined8 *)(&(pcVar1[2].definition)->format + (long)record_type._4_4_ * 2) = 0;
        }
        *(char **)(pcVar1 + 2) = pcVar1->definition[1].name;
      }
      for (record_type._4_4_ = 0; (long)record_type._4_4_ < (long)pcVar1->definition[1].name;
          record_type._4_4_ = record_type._4_4_ + 1) {
        if (*(long *)(&(pcVar1[2].definition)->format + (long)record_type._4_4_ * 2) == 0) {
          if (*(char *)(*(long *)(pcVar1->definition[1].description + (long)record_type._4_4_ * 8) +
                       0x1c) == '\0') {
            *(undefined1 *)
             (*(long *)(pcVar1->definition[1].description + (long)record_type._4_4_ * 8) + 0x1c) = 1
            ;
          }
        }
        else {
          iVar2 = coda_mem_type_update
                            ((coda_dynamic_type **)
                             (&(pcVar1[2].definition)->format + (long)record_type._4_4_ * 2),
                             *(coda_type **)
                              (*(long *)(pcVar1->definition[1].description +
                                        (long)record_type._4_4_ * 8) + 0x10));
          if (iVar2 != 0) {
            return -1;
          }
        }
      }
      break;
    case coda_backend_binary:
      for (record_type._4_4_ = 0; (long)record_type._4_4_ < *(long *)(pcVar1 + 2);
          record_type._4_4_ = record_type._4_4_ + 1) {
        iVar2 = coda_mem_type_update
                          ((coda_dynamic_type **)
                           (&(pcVar1[2].definition)->format + (long)record_type._4_4_ * 2),
                           *(coda_type **)(pcVar1->definition + 1));
        if (iVar2 != 0) {
          return -1;
        }
      }
      break;
    case 2:
      break;
    case 3:
      iVar2 = coda_mem_type_update
                        ((coda_dynamic_type **)(pcVar1 + 2),
                         *(coda_type **)&pcVar1->definition[1].type_class);
      if (iVar2 != 0) {
        return -1;
      }
    }
    if ((pcVar1[1].definition == (coda_type *)0x0) &&
       (pcVar1->definition->attributes != (coda_type_record *)0x0)) {
      pcVar4 = (coda_type *)
               coda_mem_record_new(pcVar1->definition->attributes,(coda_dynamic_type *)0x0);
      pcVar1[1].definition = pcVar4;
      if (pcVar1[1].definition == (coda_type *)0x0) {
        return -1;
      }
    }
    if ((pcVar1[1].definition == (coda_type *)0x0) ||
       (iVar2 = coda_mem_type_update
                          ((coda_dynamic_type **)&pcVar1[1].definition,
                           (coda_type *)pcVar1->definition->attributes), iVar2 == 0)) {
      type_local._4_4_ = 0;
    }
    else {
      type_local._4_4_ = -1;
    }
  }
  return type_local._4_4_;
}

Assistant:

int coda_mem_type_update(coda_dynamic_type **type, coda_type *definition)
{
    coda_mem_type *mem_type;
    int i;

    if ((*type)->backend == coda_backend_ascii || (*type)->backend == coda_backend_binary)
    {
        assert(coda_get_type_for_dynamic_type(*type) == definition);
        return 0;
    }

    assert((*type)->backend == coda_backend_memory);

    if ((*type)->definition != definition)
    {
        if (definition->type_class == coda_array_class && (*type)->definition->type_class != coda_array_class)
        {
            assert(definition->format == coda_format_xml);

            /* convert the single element into an array of a single element */
            mem_type = (coda_mem_type *)coda_mem_array_new((coda_type_array *)definition, NULL);
            if (mem_type == NULL)
            {
                return -1;
            }
            /* make sure that the array element is updated to allow it to be added to the array */
            if (coda_mem_type_update(type, ((coda_type_array *)definition)->base_type) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)mem_type);
                return -1;
            }
            if (coda_mem_array_add_element((coda_mem_array *)mem_type, *type) != 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)mem_type);
                return -1;
            }
            *type = (coda_dynamic_type *)mem_type;

            /* finally update the array itself (for e.g. attributes) */
            return coda_mem_type_update(type, definition);
        }

        if ((*type)->definition->type_class == coda_record_class && definition->type_class == coda_text_class)
        {
            assert((*type)->definition->format == coda_format_xml);
            assert(((coda_type_record *)(*type)->definition)->num_fields == 0);

            /* convert record to text */
            mem_type = (coda_mem_type *)coda_mem_string_new((coda_type_text *)definition, NULL, NULL, NULL);
            if (mem_type->attributes != NULL)
            {
                coda_dynamic_type_delete(mem_type->attributes);
            }
            mem_type->attributes = ((coda_mem_record *)*type)->attributes;
            ((coda_mem_type *)*type)->attributes = NULL;
            coda_dynamic_type_delete(*type);
            *type = (coda_dynamic_type *)mem_type;
        }
        else
        {
            assert(0);
            exit(1);
        }
    }

    mem_type = (coda_mem_type *)*type;

    switch (mem_type->tag)
    {
        case tag_mem_record:
            {
                coda_mem_record *record_type = (coda_mem_record *)mem_type;

                if (record_type->num_fields < record_type->definition->num_fields)
                {
                    coda_dynamic_type **new_field_type;

                    /* increase the size for the child elements array until it matches the size in the definition */
                    new_field_type = realloc(record_type->field_type,
                                             record_type->definition->num_fields * sizeof(coda_dynamic_type *));
                    if (new_field_type == NULL)
                    {
                        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                                       record_type->definition->num_fields * sizeof(coda_dynamic_type *), __FILE__,
                                       __LINE__);

                        return -1;
                    }
                    record_type->field_type = new_field_type;
                    for (i = record_type->num_fields; i < record_type->definition->num_fields; i++)
                    {
                        record_type->field_type[i] = NULL;
                    }
                    record_type->num_fields = record_type->definition->num_fields;
                }
                for (i = 0; i < record_type->definition->num_fields; i++)
                {
                    if (record_type->field_type[i] == NULL)
                    {
                        if (!record_type->definition->field[i]->optional)
                        {
                            record_type->definition->field[i]->optional = 1;
                        }
                    }
                    else
                    {
                        if (coda_mem_type_update(&record_type->field_type[i],
                                                 record_type->definition->field[i]->type) != 0)
                        {
                            return -1;
                        }
                    }
                }
            }
            break;
        case tag_mem_array:
            {
                for (i = 0; i < ((coda_mem_array *)mem_type)->num_elements; i++)
                {
                    if (coda_mem_type_update(&((coda_mem_array *)mem_type)->element[i],
                                             ((coda_mem_array *)mem_type)->definition->base_type) != 0)
                    {
                        return -1;
                    }
                }
            }
            break;
        case tag_mem_data:
            break;
        case tag_mem_special:
            if (coda_mem_type_update(&((coda_mem_special *)mem_type)->base_type,
                                     ((coda_mem_special *)mem_type)->definition->base_type) != 0)
            {
                return -1;
            }
            break;
    }

    if (mem_type->attributes == NULL && mem_type->definition->attributes != NULL)
    {
        mem_type->attributes = (coda_dynamic_type *)coda_mem_record_new(mem_type->definition->attributes, NULL);
        if (mem_type->attributes == NULL)
        {
            return -1;
        }
    }
    if (mem_type->attributes != NULL)
    {
        if (coda_mem_type_update((coda_dynamic_type **)&mem_type->attributes,
                                 (coda_type *)mem_type->definition->attributes) != 0)
        {
            return -1;
        }
    }

    return 0;
}